

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,ArrayPtr<const_char> *rest_6,
          String *rest_7,ArrayPtr<const_char> *rest_8,StringTree *rest_9,StringTree *rest_10,
          StringTree *rest_11,ArrayPtr<const_char> *rest_12,ArrayPtr<const_char> *rest_13,
          ArrayPtr<const_char> *rest_14,ArrayPtr<const_char> *rest_15,ArrayPtr<const_char> *rest_16,
          String *rest_17,ArrayPtr<const_char> *rest_18,ArrayPtr<const_char> *rest_19,
          ArrayPtr<const_char> *rest_20,String *rest_21,ArrayPtr<const_char> *rest_22,
          ArrayPtr<const_char> *rest_23,ArrayPtr<const_char> *rest_24,StringTree *rest_25,
          ArrayPtr<const_char> *rest_26)

{
  Array<char> *pAVar1;
  size_t pos_00;
  char *pcVar2;
  Branch *pBVar3;
  String *pSVar4;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_27;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_7_00;
  StringTree *rest_8_00;
  StringTree *rest_9_00;
  StringTree *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  ArrayPtr<const_char> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  String *rest_16_00;
  ArrayPtr<const_char> *rest_17_00;
  ArrayPtr<const_char> *rest_18_00;
  ArrayPtr<const_char> *rest_19_00;
  String *rest_20_00;
  ArrayPtr<const_char> *rest_21_00;
  ArrayPtr<const_char> *rest_22_00;
  ArrayPtr<const_char> *rest_23_00;
  StringTree *rest_24_00;
  ArrayPtr<const_char> *rest_25_00;
  StringTree local_98;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_60 = rest_1;
  rest_local_1 = rest;
  rest_local = (ArrayPtr<const_char> *)first;
  first_local = (String *)branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar2 = String::begin(&this->text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar3->index = (long)pos - (long)pcVar2;
  pSVar4 = mv<kj::String>((String *)rest_local);
  StringTree(&local_98,pSVar4);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar3->content,&local_98);
  ~StringTree(&local_98);
  pos_00 = branchIndex_local;
  pAVar1 = &first_local->content;
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest_local_1);
  rest_27 = fwd<kj::ArrayPtr<char_const>>(local_60);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pSVar4 = fwd<kj::String>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::StringTree>(rest_9);
  rest_9_00 = fwd<kj::StringTree>(rest_10);
  rest_10_00 = fwd<kj::StringTree>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::String>(rest_17);
  rest_17_00 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  rest_18_00 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  rest_19_00 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  rest_20_00 = fwd<kj::String>(rest_21);
  rest_21_00 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  rest_22_00 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  rest_23_00 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  rest_24_00 = fwd<kj::StringTree>(rest_25);
  rest_25_00 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,(char *)pos_00,(size_t)((long)&pAVar1->ptr + 1),first_00,rest_27,rest_1_00,
             rest_2_00,rest_3_00,rest_4_00,rest_5_00,pSVar4,rest_7_00,rest_8_00,rest_9_00,rest_10_00
             ,rest_11_00,rest_12_00,rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,
             rest_18_00,rest_19_00,rest_20_00,rest_21_00,rest_22_00,rest_23_00,rest_24_00,rest_25_00
            );
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}